

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall
imrt::ApertureILS::getOrderedApertureNeighbors
          (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  pointer ppVar1;
  pointer ppVar2;
  Station *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  pair<int,_int> pVar6;
  pair<int,_int> pVar7;
  long lVar8;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *ppVar9;
  pointer ppVar10;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *ppVar11;
  pair<int,_int> pVar12;
  iterator iVar13;
  ulong uVar14;
  _List_node_base *p_Var15;
  long lVar16;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  a_list;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_b0;
  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
  *local_a0;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_98;
  iterator iStack_90;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_88;
  ulong local_78;
  uint local_6c;
  Station *local_68;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_60;
  undefined1 local_48 [8];
  Station *local_40;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&local_60,__x);
  (*(this->super_ILS)._vptr_ILS[7])(local_48,this,P);
  local_68 = local_40;
  local_88 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0;
  local_98 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0;
  iStack_90._M_current = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = 0;
  local_a0 = (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              *)__return_storage_ptr__;
  if (local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
      _M_size != 0) {
    local_78 = 0;
    p_Var15 = local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
              _M_node.super__List_node_base._M_next;
    do {
      if (*(int *)&(p_Var15[1]._M_next)->_M_prev == local_68->angle) {
        local_6c = (uint)local_78;
      }
      else {
        if (0 < *(int *)&p_Var15[1]._M_next[4]._M_next) {
          lVar16 = 0;
          do {
            pVar12 = (pair<int,_int>)(lVar16 << 0x20 | local_78);
            for (lVar8 = 0;
                iVar4 = Collimator::getXdim((Collimator *)p_Var15[1]._M_next[0xb]._M_next),
                lVar8 < iVar4; lVar8 = lVar8 + 1) {
              iVar4 = (int)lVar16;
              pVar7 = Station::getApertureShape((Station *)p_Var15[1]._M_next,iVar4,(int)lVar8);
              pVar6 = Collimator::getActiveRange
                                ((Collimator *)p_Var15[1]._M_next[0xb]._M_next,(int)lVar8,
                                 *(int *)&(p_Var15[1]._M_next)->_M_prev);
              if (pVar6.first != -1) {
                uVar5 = Station::getBeamIndex
                                  ((Station *)p_Var15[1]._M_next,
                                   (pair<int,_int>)(((long)pVar7 << 0x20) + lVar8));
                bVar3 = Station::isOpenBeamlet((Station *)p_Var15[1]._M_next,uVar5,iVar4);
                local_b0.first = pVar12;
                if (bVar3) {
                  local_b0.second = (pair<int,_int>)(((ulong)uVar5 << 0x20) + 0xffffffff);
                  if (iStack_90._M_current == local_88) {
                    std::
                    vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                    ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                              ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                                *)&local_98,iStack_90,&local_b0);
                  }
                  else {
LAB_00126604:
                    (iStack_90._M_current)->first = pVar12;
                    (iStack_90._M_current)->second = local_b0.second;
                    iStack_90._M_current = iStack_90._M_current + 1;
                  }
                }
                else {
                  local_b0.second = (pair<int,_int>)((ulong)uVar5 << 0x20 | 1);
                  if (iStack_90._M_current != local_88) goto LAB_00126604;
                  std::
                  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                  ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                            ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                              *)&local_98,iStack_90,&local_b0);
                }
                if (pVar7.first != pVar7.second) {
                  uVar5 = Station::getBeamIndex
                                    ((Station *)p_Var15[1]._M_next,
                                     (pair<int,_int>)(((ulong)pVar7 & 0xffffffff00000000) + lVar8));
                  bVar3 = Station::isOpenBeamlet((Station *)p_Var15[1]._M_next,uVar5,iVar4);
                  if (bVar3) {
                    local_b0.second = (pair<int,_int>)((ulong)uVar5 << 0x20 | 0xfffffffe);
                    if (iStack_90._M_current == local_88) {
                      local_b0.first = pVar12;
                      std::
                      vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                      ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                                ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                                  *)&local_98,iStack_90,&local_b0);
                    }
                    else {
LAB_001266b0:
                      (iStack_90._M_current)->first = pVar12;
                      (iStack_90._M_current)->second = local_b0.second;
                      iStack_90._M_current = iStack_90._M_current + 1;
                      local_b0.first = pVar12;
                    }
                  }
                  else {
                    local_b0.second = (pair<int,_int>)((ulong)uVar5 << 0x20 | 1);
                    if (iStack_90._M_current != local_88) goto LAB_001266b0;
                    local_b0.first = pVar12;
                    std::
                    vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                    ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                              ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                                *)&local_98,iStack_90,&local_b0);
                  }
                }
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < *(int *)&p_Var15[1]._M_next[4]._M_next);
        }
        p_Var15 = p_Var15->_M_next;
      }
      local_78 = local_78 + 1;
    } while (local_78 <
             local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
             _M_node._M_size);
    local_78 = (ulong)local_6c;
  }
  iVar13._M_current = iStack_90._M_current;
  ppVar11 = local_98;
  if ((local_98 != iStack_90._M_current) && (local_98 + 1 != iStack_90._M_current)) {
    lVar16 = 0x10;
    do {
      iVar4 = rand();
      lVar8 = (long)iVar4 % ((lVar16 >> 4) + 1);
      if (lVar16 != lVar8 * 0x10) {
        ppVar9 = ppVar11 + lVar8;
        iVar4 = *(int *)((long)&(ppVar11->first).first + lVar16);
        *(int *)((long)&(ppVar11->first).first + lVar16) = (ppVar9->first).first;
        (ppVar9->first).first = iVar4;
        iVar4 = *(int *)((long)&(ppVar11->first).second + lVar16);
        *(int *)((long)&(ppVar11->first).second + lVar16) = (ppVar9->first).second;
        (ppVar9->first).second = iVar4;
        iVar4 = *(int *)((long)&(ppVar11->second).first + lVar16);
        *(int *)((long)&(ppVar11->second).first + lVar16) = (ppVar9->second).first;
        (ppVar9->second).first = iVar4;
        iVar4 = *(int *)((long)&(ppVar11->second).second + lVar16);
        *(int *)((long)&(ppVar11->second).second + lVar16) = (ppVar9->second).second;
        (ppVar9->second).second = iVar4;
      }
      ppVar9 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
               ((long)&ppVar11[1].first.first + lVar16);
      lVar16 = lVar16 + 0x10;
    } while (ppVar9 != iVar13._M_current);
  }
  this_00 = local_68;
  if (0 < local_68->max_apertures) {
    lVar16 = 0;
    do {
      pVar12 = (pair<int,_int>)((lVar16 << 0x20) + local_78);
      for (lVar8 = 0; iVar4 = Collimator::getXdim(this_00->collimator), lVar8 < iVar4;
          lVar8 = lVar8 + 1) {
        pVar7 = Collimator::getActiveRange(this_00->collimator,(int)lVar8,this_00->angle);
        if (pVar7.first != -1) {
          iVar4 = (int)lVar16;
          pVar7 = Station::getApertureShape(this_00,iVar4,(int)lVar8);
          uVar5 = Station::getBeamIndex(this_00,(pair<int,_int>)(((long)pVar7 << 0x20) + lVar8));
          bVar3 = Station::isOpenBeamlet(this_00,uVar5,iVar4);
          local_b0.first = pVar12;
          if (bVar3) {
            local_b0.second = (pair<int,_int>)(((ulong)uVar5 << 0x20) + 0xffffffff);
            iVar13._M_current = *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 8);
            if (iVar13._M_current ==
                *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 0x10)) {
              std::
              vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                        (local_a0,iVar13,&local_b0);
            }
            else {
LAB_00126874:
              (iVar13._M_current)->first = pVar12;
              (iVar13._M_current)->second = local_b0.second;
              *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 0x10;
            }
          }
          else {
            local_b0.second = (pair<int,_int>)((ulong)uVar5 << 0x20 | 1);
            iVar13._M_current = *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 8);
            if (iVar13._M_current !=
                *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 0x10))
            goto LAB_00126874;
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                      (local_a0,iVar13,&local_b0);
          }
          if (pVar7.first != pVar7.second) {
            uVar5 = Station::getBeamIndex
                              (this_00,(pair<int,_int>)(((ulong)pVar7 & 0xffffffff00000000) + lVar8)
                              );
            bVar3 = Station::isOpenBeamlet(this_00,uVar5,iVar4);
            if (bVar3) {
              local_b0.second = (pair<int,_int>)((ulong)uVar5 << 0x20 | 0xfffffffe);
              iVar13._M_current =
                   *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 8);
              if (iVar13._M_current ==
                  *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 0x10)) {
                local_b0.first = pVar12;
                std::
                vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                          (local_a0,iVar13,&local_b0);
              }
              else {
LAB_00126918:
                (iVar13._M_current)->first = pVar12;
                (iVar13._M_current)->second = local_b0.second;
                *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 0x10;
                local_b0.first = pVar12;
              }
            }
            else {
              local_b0.second = (pair<int,_int>)((ulong)uVar5 << 0x20 | 1);
              iVar13._M_current =
                   *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 8);
              if (iVar13._M_current !=
                  *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 0x10))
              goto LAB_00126918;
              local_b0.first = pVar12;
              std::
              vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                        (local_a0,iVar13,&local_b0);
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < this_00->max_apertures);
  }
  ppVar1 = *(pointer *)local_a0;
  ppVar2 = *(pointer *)(local_a0 + 8);
  if ((ppVar1 != ppVar2) && (ppVar1 + 1 != ppVar2)) {
    lVar16 = 0x10;
    do {
      iVar4 = rand();
      lVar8 = (long)iVar4 % ((lVar16 >> 4) + 1);
      if (lVar16 != lVar8 * 0x10) {
        ppVar10 = ppVar1 + lVar8;
        iVar4 = *(int *)((long)&(ppVar1->first).first + lVar16);
        *(int *)((long)&(ppVar1->first).first + lVar16) = (ppVar10->first).first;
        (ppVar10->first).first = iVar4;
        iVar4 = *(int *)((long)&(ppVar1->first).second + lVar16);
        *(int *)((long)&(ppVar1->first).second + lVar16) = (ppVar10->first).second;
        (ppVar10->first).second = iVar4;
        iVar4 = *(int *)((long)&(ppVar1->second).first + lVar16);
        *(int *)((long)&(ppVar1->second).first + lVar16) = (ppVar10->second).first;
        (ppVar10->second).first = iVar4;
        iVar4 = *(int *)((long)&(ppVar1->second).second + lVar16);
        *(int *)((long)&(ppVar1->second).second + lVar16) = (ppVar10->second).second;
        (ppVar10->second).second = iVar4;
      }
      ppVar10 = (pointer)((long)&ppVar1[1].first.first + lVar16);
      lVar16 = lVar16 + 0x10;
    } while (ppVar10 != ppVar2);
  }
  if (iStack_90._M_current != local_98) {
    lVar16 = 0;
    uVar14 = 0;
    do {
      ppVar11 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
                ((long)&(local_98->first).first + lVar16);
      iVar13._M_current = *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 8);
      if (iVar13._M_current ==
          *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a0 + 0x10)) {
        std::
        vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
        ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>const&>
                  (local_a0,iVar13,ppVar11);
      }
      else {
        pVar12 = ppVar11->second;
        (iVar13._M_current)->first = ppVar11->first;
        (iVar13._M_current)->second = pVar12;
        *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 0x10;
      }
      uVar14 = uVar14 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar14 < (ulong)((long)iStack_90._M_current - (long)local_98 >> 4));
  }
  if (local_98 != (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0) {
    operator_delete(local_98);
  }
  while (local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_60) {
    p_Var15 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_60.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var15;
  }
  return (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          *)local_a0;
}

Assistant:

vector < pair<pair<int, int>, pair<int, int>> > ApertureILS::getOrderedApertureNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  
  pair<bool, pair<Station*, int>> target_beam = getBestLSBeamlet(P);
  Station * target_station = target_beam.second.first;
  int s_target;
  
  vector<pair< pair<int,int> , pair<int, int> >> a_list, final_list;
  list<Station*>::iterator st;
  int beamlet;
  st = stations.begin();
  
  pair <int,int> pattern;
  pair <int,int> active;
  
  for (int s = 0; s < stations.size(); s++) {
    if ((*st)->getAngle() == target_station->getAngle()){
      s_target=s;
      continue;
    }
    for (int a = 0; a < (*st)->getNbApertures(); a++){
      for (int k = 0; k< (*st)->collimator.getXdim() ; k++){
        //One pair -k (-row) for closing aperture
        //One pair (k) (row) for opening aperture
        pattern = (*st)->getApertureShape(a, k);
        active = (*st)->collimator.getActiveRange(k, (*st)->getAngle());
        if (active.first == -1) continue;
        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.first));
        if((*st)->isOpenBeamlet(beamlet, a))
          a_list.push_back(make_pair(make_pair(s,a) , make_pair(-1,beamlet)));
        else 
          a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        
        if (pattern.first != pattern.second) {
          beamlet = (*st)->getBeamIndex(make_pair(k,pattern.second));
          if((*st)->isOpenBeamlet(beamlet, a))
            a_list.push_back(make_pair(make_pair(s,a) , make_pair(-2,beamlet)));
          else 
            a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        }
      }
    }
    std::advance(st,1);
  }
  std::random_shuffle(a_list.begin(), a_list.end());
  
  // Add target station neighbors
  for (int a = 0; a < target_station->getNbApertures(); a++) {
    for (int k = 0; k< target_station->collimator.getXdim() ; k++) {
      active = target_station->collimator.getActiveRange(k, target_station->getAngle());
      if (active.first == -1) continue;
      pattern = target_station->getApertureShape(a, k);
      
      beamlet = target_station->getBeamIndex(make_pair(k,pattern.first));
      if (target_station->isOpenBeamlet(beamlet, a))
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-1,beamlet)));
      else 
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      
      if (pattern.first != pattern.second) {
        beamlet = target_station->getBeamIndex(make_pair(k,pattern.second));
        if (target_station->isOpenBeamlet(beamlet, a))
          final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-2,beamlet)));
        else 
          final_list.push_back(make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      }
    }
  }
  std::random_shuffle(final_list.begin(), final_list.end());
  for (int i=0; i<a_list.size(); i++) {
    final_list.push_back(a_list[i]);
  }
  
  return(final_list);
}